

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O2

RealType __thiscall OpenMD::EAMAdapter::getBeta(EAMAdapter *this)

{
  ZhouParameters zhouParam;
  ZhouParameters local_118;
  
  getZhouParam(&local_118,this);
  ZhouParameters::~ZhouParameters(&local_118);
  return local_118.beta;
}

Assistant:

RealType EAMAdapter::getBeta() {
    ZhouParameters zhouParam = getZhouParam();
    return zhouParam.beta;
  }